

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

int __thiscall
METADemuxer::addStream
          (METADemuxer *this,string *codec,string *codecStreamName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *addParams)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppFVar2;
  ContainerToReaderWrapper *this_00;
  pointer pbVar3;
  pointer pMVar4;
  size_t __n;
  iterator __position;
  pointer pSVar5;
  bool bVar6;
  int32_t iVar7;
  int iVar8;
  int32_t iVar9;
  const_iterator cVar10;
  undefined4 extraout_var;
  long *plVar11;
  undefined8 *puVar12;
  iterator iVar13;
  iterator iVar14;
  AbstractStreamReader *pAVar15;
  long lVar16;
  long lVar17;
  undefined4 *puVar18;
  ulong *puVar19;
  string *codecStreamName_00;
  string *fileName_1;
  string *psVar20;
  int64_t *piVar21;
  undefined8 uVar22;
  pointer pbVar23;
  pointer pMVar24;
  ContainerToReaderWrapper *pCVar25;
  uint uVar26;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var27;
  pointer pcVar28;
  ulong uVar29;
  METADemuxer *pMVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var32;
  bool bVar33;
  int32_t pid;
  bool isSubStream;
  AbstractStreamReader *codecReader;
  string tmpname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mplsNames;
  AbstractReader *dataReader;
  FileListIterator *listIterator;
  MPLSStreamInfo streamInfo;
  string unquotedStreamName;
  string fileExt;
  string local_450;
  int32_t local_430;
  bool local_429;
  AbstractStreamReader *local_428;
  METADemuxer *local_420;
  undefined1 local_418 [16];
  undefined1 local_408 [48];
  undefined1 local_3d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  BufferedReader *local_3a0;
  ContainerType local_394;
  uint local_390;
  int local_38c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_388;
  ulong local_380;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_378;
  undefined1 local_370 [32];
  string *local_350;
  _Base_ptr local_348;
  FileListIterator *local_340;
  long local_338;
  undefined1 local_330 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_310;
  pointer local_308;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [3];
  bool local_2b6;
  ContainerType local_2b4;
  MPLSStreamInfo *local_2b0;
  MPLSStreamInfo *local_2a8;
  uint *local_178;
  undefined8 local_170;
  uint local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  uint *local_158;
  undefined8 local_150;
  uint local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  uint *local_138;
  undefined8 local_130;
  uint local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  uint *local_118;
  undefined8 local_110;
  uint local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  uint *local_f8;
  undefined8 local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uint *local_d8;
  undefined8 local_d0;
  uint local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  uint *local_b8;
  undefined8 local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint *local_98;
  undefined8 local_90;
  uint local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  string local_78;
  _Base_ptr local_58;
  string local_50;
  
  local_430 = 0;
  local_420 = this;
  local_2f8._0_8_ = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"track","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
  }
  local_348 = &(addParams->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (cVar10._M_node != local_348) {
    local_430 = strToInt32(*(char **)(cVar10._M_node + 2));
  }
  local_2f8._0_8_ = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"subTrack","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)local_2f8);
  local_350 = codec;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
  }
  iVar9 = local_430;
  local_330._16_8_ = codecStreamName;
  if (cVar10._M_node != local_348) {
    iVar7 = strToInt32((string *)(cVar10._M_node + 2));
    local_430 = iVar9 * 0x10000 + iVar7;
  }
  uVar22 = local_330._16_8_;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unquoteStr(&local_78,(string *)local_330._16_8_);
  extractFileExt((string *)local_2f8,(string *)uVar22);
  psVar20 = local_350;
  strToLowerCase(&local_50,(string *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
  }
  local_330._24_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  paStack_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_308 = (pointer)0x0;
  __n = psVar20->_M_string_length;
  if ((__n != ::h264DepCodecInfo.programName._M_string_length) ||
     ((bVar33 = true, __n != 0 &&
      (iVar8 = bcmp((psVar20->_M_dataplus)._M_p,::h264DepCodecInfo.programName._M_dataplus._M_p,__n)
      , iVar8 != 0)))) {
    local_2f8._0_8_ = local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"subClip","");
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)local_2f8);
    bVar33 = cVar10._M_node != local_348;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != local_2e8) {
      operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
    }
  }
  local_429 = bVar33;
  iVar8 = std::__cxx11::string::compare((char *)&local_50);
  local_388 = &addParams->_M_t;
  if (iVar8 == 0) {
LAB_001a2da7:
    uVar22 = local_330._16_8_;
    getMplsInfo((vector<MPLSParser,_std::allocator<MPLSParser>_> *)local_418,local_420,
                (string *)local_330._16_8_);
    local_2e8[0]._0_8_ = local_308;
    local_2f8._8_8_ = paStack_310;
    local_2f8._0_8_ = local_330._24_8_;
    local_308 = (pointer)local_408._0_8_;
    local_330._24_8_ = local_418._0_8_;
    paStack_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._8_8_;
    local_418._0_8_ = (pointer)0x0;
    local_418._8_8_ = (pointer)0x0;
    local_408._0_8_ = (pointer)0x0;
    std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector
              ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)local_2f8);
    std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector
              ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)local_418);
    splitQuotedStr_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3d8,((_Alloc_hider *)uVar22)->_M_p,'+');
    if (paStack_310 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._24_8_) {
      local_390 = 0xffffffff;
      local_394 = 0xff;
      local_380 = 0;
      local_38c = -1;
    }
    else {
      local_394 = 0xff;
      local_38c = -1;
      local_380 = 0;
      local_390 = 0xffffffff;
      p_Var27 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)0x0;
      do {
        uVar22 = local_330._24_8_;
        unquoteStr((string *)local_2f8,(string *)(local_3d8._0_8_ + (long)p_Var27 * 0x20));
        std::__cxx11::string::operator=((string *)&local_78,(string *)local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._0_8_ != local_2e8) {
          operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
        }
        paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(uVar22 + (long)p_Var27 * 0xb * 0x10);
        local_378 = p_Var27;
        if (*(long *)(paVar31->_M_local_buf + 0x28) != *(long *)(paVar31->_M_local_buf + 0x20)) {
          lVar16 = 8;
          uVar29 = 0;
          do {
            local_418._0_8_ = local_408;
            local_418._8_8_ = (pointer)0x0;
            local_408._0_8_ = local_408._0_8_ & 0xffffffffffffff00;
            if (local_429 == true) {
              if (*(long *)(paVar31->_M_local_buf + 0x98) == *(long *)(paVar31->_M_local_buf + 0xa0)
                 ) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,
                           "Current playlist file doesn\'t has MVC track info. Please, remove MVC track from the track list"
                           ,0x5e);
                puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
                std::__cxx11::stringbuf::str();
                *puVar18 = 0x1f6;
                *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
                if (local_98 == &local_88) {
                  puVar18[6] = local_88;
                  puVar18[7] = uStack_84;
                  puVar18[8] = uStack_80;
                  puVar18[9] = uStack_7c;
                }
                else {
                  *(uint **)(puVar18 + 2) = local_98;
                  *(ulong *)(puVar18 + 6) = CONCAT44(uStack_84,local_88);
                }
                *(undefined8 *)(puVar18 + 4) = local_90;
                local_90 = 0;
                local_88 = local_88 & 0xffffff00;
                local_98 = &local_88;
                __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException)
                ;
              }
              if ((ulong)(*(long *)(paVar31->_M_local_buf + 0xa0) -
                          *(long *)(paVar31->_M_local_buf + 0x98) >> 5) <= uVar29) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,
                           "Bad playlist file: number of CLPI files for AVC and VMC parts do not match"
                           ,0x4a);
                puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
                std::__cxx11::stringbuf::str();
                *puVar18 = 0x1f6;
                *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
                if (local_b8 == &local_a8) {
                  puVar18[6] = local_a8;
                  puVar18[7] = uStack_a4;
                  puVar18[8] = uStack_a0;
                  puVar18[9] = uStack_9c;
                }
                else {
                  *(uint **)(puVar18 + 2) = local_b8;
                  *(ulong *)(puVar18 + 6) = CONCAT44(uStack_a4,local_a8);
                }
                *(undefined8 *)(puVar18 + 4) = local_b0;
                local_b0 = 0;
                local_a8 = local_a8 & 0xffffff00;
                local_b8 = &local_a8;
                __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException)
                ;
              }
            }
            std::__cxx11::string::_M_assign((string *)local_418);
            mplsTrackToFullName((string *)local_2f8,&local_78,(string *)local_418);
            if ((paVar31->_M_local_buf[0x84] == '\x01') &&
               (bVar33 = fileExists((string *)local_2f8), !bVar33)) {
              mplsTrackToSSIFName(&local_450,&local_78,
                                  (string *)(*(long *)(paVar31->_M_local_buf + 0x20) + lVar16));
              std::__cxx11::string::operator=((string *)local_2f8,(string *)&local_450);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_450._M_dataplus._M_p != &local_450.field_2) {
                operator_delete(local_450._M_dataplus._M_p,
                                (ulong)(local_450.field_2._M_allocated_capacity + 1));
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_3b8,(value_type *)local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._0_8_ != local_2e8) {
              operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
            }
            if ((pointer)local_418._0_8_ != (pointer)local_408) {
              operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
            }
            uVar29 = uVar29 + 1;
            lVar16 = lVar16 + 0x30;
          } while (uVar29 < (ulong)((*(long *)(paVar31->_M_local_buf + 0x28) -
                                     *(long *)(paVar31->_M_local_buf + 0x20) >> 4) *
                                   -0x5555555555555555));
        }
        MPLSParser::getStreamByPID((MPLSStreamInfo *)local_2f8,(MPLSParser *)paVar31,local_430);
        psVar20 = local_350;
        p_Var32 = local_388;
        pMVar30 = local_420;
        if ((local_2f8._4_4_ == SUB_PGS) && (local_2b6 == true)) {
          local_38c = addPGSubStream(local_420,local_350,&local_78,
                                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)local_388,local_2b0);
          local_390 = addPGSubStream(pMVar30,psVar20,&local_78,
                                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)p_Var32,local_2a8);
          local_380 = CONCAT71((int7)(CONCAT44(extraout_var,local_390) >> 8),local_2b6);
          local_394 = local_2b4;
        }
        p_Var27 = local_378;
        MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_2f8);
        p_Var27 = p_Var27 + 1;
      } while (p_Var27 < (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)(((long)paStack_310 - local_330._24_8_ >> 4) * 0x2e8ba2e8ba2e8ba3));
      local_380 = local_380 & 0xffffffffffffff01;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3d8);
    psVar20 = local_350;
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar8 == 0) goto LAB_001a2da7;
    extractFileList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_418,(string *)local_330._16_8_);
    local_2e8[0]._0_8_ =
         local_3b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2f8._8_8_ =
         local_3b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2f8._0_8_ =
         local_3b8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_408._0_8_;
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_418._0_8_;
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_418._8_8_;
    local_418._0_8_ = (pointer)0x0;
    local_418._8_8_ = (pointer)0x0;
    local_408._0_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_418);
    local_390 = 0xffffffff;
    local_394 = 0xff;
    local_380 = 0;
    local_38c = -1;
  }
  iVar8 = (int)((ulong)((long)local_3b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_3b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
  uVar26 = iVar8 - 1;
  local_428 = (AbstractStreamReader *)CONCAT44(local_428._4_4_,uVar26);
  if (0 < iVar8) {
    paVar31 = &local_450.field_2;
    local_378 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&local_420->m_processedTracks;
    local_58 = &(local_420->m_processedTracks)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      pbVar3 = local_3b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3d8._0_8_ = local_3d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"_#","");
      plVar11 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_3d8,0,(char *)0x0,
                                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)((long)pbVar3 + (ulong)uVar26 * 2 * 0x10))->
                                   _M_allocated_capacity);
      puVar19 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_450.field_2._M_allocated_capacity = *puVar19;
        local_450.field_2._8_8_ = plVar11[3];
        local_450._M_dataplus._M_p = (pointer)paVar31;
      }
      else {
        local_450.field_2._M_allocated_capacity = *puVar19;
        local_450._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_450._M_string_length = plVar11[1];
      *plVar11 = (long)puVar19;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      int32ToStr_abi_cxx11_((string *)local_370,(int32_t *)&local_428);
      uVar22 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != paVar31) {
        uVar22 = local_450.field_2._M_allocated_capacity;
      }
      pbVar3 = (pointer)((long)&((_Alloc_hider *)local_370._8_8_)->_M_p + local_450._M_string_length
                        );
      if ((ulong)uVar22 < pbVar3) {
        pbVar23 = (pointer)0xf;
        if ((pointer)local_370._0_8_ != (pointer)(local_370 + 0x10)) {
          pbVar23 = (pointer)local_370._16_8_;
        }
        if (pbVar23 < pbVar3) goto LAB_001a330d;
        plVar11 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_370,0,(char *)0x0,
                                     (ulong)local_450._M_dataplus._M_p);
      }
      else {
LAB_001a330d:
        plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_450,local_370._0_8_);
      }
      local_418._0_8_ = local_408;
      pMVar24 = (pointer)(plVar11 + 2);
      if ((pointer)*plVar11 == pMVar24) {
        local_408._0_8_ = *(undefined8 *)pMVar24;
        local_408._8_4_ = (undefined4)plVar11[3];
        local_408._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
      }
      else {
        local_408._0_8_ = *(undefined8 *)pMVar24;
        local_418._0_8_ = (pointer)*plVar11;
      }
      local_418._8_8_ = plVar11[1];
      *plVar11 = (long)pMVar24;
      plVar11[1] = 0;
      *(undefined1 *)&((_Alloc_hider *)&pMVar24->PlayList_playback_type)->_M_p = 0;
      local_340 = (FileListIterator *)local_330;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"_","");
      pMVar24 = (pointer)0xf;
      if ((pointer)local_418._0_8_ != (pointer)local_408) {
        pMVar24 = (pointer)local_408._0_8_;
      }
      pMVar4 = (pointer)((long)&((_Alloc_hider *)local_418._8_8_)->_M_p + local_338);
      if (pMVar24 < pMVar4) {
        pMVar24 = (pointer)0xf;
        if (local_340 != (FileListIterator *)local_330) {
          pMVar24 = (pointer)local_330._0_8_;
        }
        if (pMVar24 < pMVar4) goto LAB_001a33f3;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,local_418._0_8_);
      }
      else {
LAB_001a33f3:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_418,(ulong)local_340);
      }
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 == paVar1) {
        local_2e8[0]._0_8_ = paVar1->_M_allocated_capacity;
        local_2e8[0]._8_8_ = puVar12[3];
        local_2f8._0_8_ = local_2e8;
      }
      else {
        local_2e8[0]._0_8_ = paVar1->_M_allocated_capacity;
        local_2f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar12;
      }
      local_2f8._8_8_ = puVar12[1];
      *puVar12 = paVar1;
      puVar12[1] = 0;
      paVar1->_M_local_buf[0] = '\0';
      if (local_340 != (FileListIterator *)local_330) {
        operator_delete(local_340,(ulong)(local_330._0_8_ + 1));
      }
      if ((pointer)local_418._0_8_ != (pointer)local_408) {
        operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
      }
      if ((pointer)local_370._0_8_ != (pointer)(local_370 + 0x10)) {
        operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != paVar31) {
        operator_delete(local_450._M_dataplus._M_p,
                        (ulong)(local_450.field_2._M_allocated_capacity + 1));
      }
      if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
      }
      local_418._0_8_ = local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"subClip","");
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(local_388,(string *)local_418);
      if ((pointer)local_418._0_8_ != (pointer)local_408) {
        operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
      }
      if (cVar10._M_node == local_348) {
        local_418._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"_track_","");
        std::__cxx11::string::_M_append(local_2f8,local_418._0_8_);
      }
      else {
        local_418._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"_subtrack_","");
        std::__cxx11::string::_M_append(local_2f8,local_418._0_8_);
      }
      if ((pointer)local_418._0_8_ != (pointer)local_408) {
        operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
      }
      int32ToStr_abi_cxx11_((string *)local_418,&local_430);
      std::__cxx11::string::_M_append((char *)local_2f8,local_418._0_8_);
      if ((pointer)local_418._0_8_ != (pointer)local_408) {
        operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
      }
      iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_378,(key_type *)local_2f8);
      if (iVar13._M_node == local_58) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_378,(key_type *)local_2f8);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_3b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)(int)local_428 * 2 * 0x10));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
      }
      iVar8 = (int)local_428;
      uVar26 = (int)local_428 - 1;
      local_428 = (AbstractStreamReader *)CONCAT44(local_428._4_4_,uVar26);
      psVar20 = local_350;
    } while (0 < iVar8);
  }
  if (local_3b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_3b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar8 = -1;
    goto LAB_001a45fd;
  }
  local_340 = (FileListIterator *)0x0;
  if (0x20 < (ulong)((long)local_3b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_3b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    local_340 = (FileListIterator *)operator_new(0x28);
    (local_340->super_FileNameIterator)._vptr_FileNameIterator =
         (_func_int **)&PTR_getNextName_abi_cxx11__0023e328;
    (local_340->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_340->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_340->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340->m_index = 0;
    __position._M_current =
         (local_420->m_iterators).
         super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_420->m_iterators).
        super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<FileListIterator*,std::allocator<FileListIterator*>>::
      _M_realloc_insert<FileListIterator*const&>
                ((vector<FileListIterator*,std::allocator<FileListIterator*>> *)
                 &local_420->m_iterators,__position,&local_340);
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = local_340;
      pppFVar2 = &(local_420->m_iterators).
                  super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppFVar2 = *pppFVar2 + 1;
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pbVar3 = local_3b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        bVar33 = paVar31 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        local_3b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar1, bVar33;
        paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar31->_M_local_buf + 0x20)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_340->m_files,(value_type *)paVar31);
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_3b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    }
  }
  pMVar30 = local_420;
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
           ::find(&(local_420->m_containerReader).m_demuxers._M_t,
                  local_3b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  if ((_Rb_tree_header *)iVar14._M_node ==
      &(pMVar30->m_containerReader).m_demuxers._M_t._M_impl.super__Rb_tree_header) {
    File::File((File *)local_418);
    pbVar3 = local_3b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar28 = (pointer)0x0;
    if (local_3b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_3b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar8 = File::open((File *)local_418,(char *)paVar31->_M_allocated_capacity,1,0);
        if ((char)iVar8 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2f8,"Can\'t open file: ",0x11);
          std::operator<<((ostream *)local_2f8,(char *)paVar31->_M_allocated_capacity);
          puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar18 = 0x1f6;
          *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
          if (local_d8 == &local_c8) {
            puVar18[6] = local_c8;
            puVar18[7] = uStack_c4;
            puVar18[8] = uStack_c0;
            puVar18[9] = uStack_bc;
          }
          else {
            *(uint **)(puVar18 + 2) = local_d8;
            *(ulong *)(puVar18 + 6) = CONCAT44(uStack_c4,local_c8);
          }
          *(undefined8 *)(puVar18 + 4) = local_d0;
          local_d0 = 0;
          local_c8 = local_c8 & 0xffffff00;
          local_d8 = &local_c8;
          __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        local_2f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        piVar21 = (int64_t *)local_2f8;
        File::size((File *)local_418,(int64_t *)local_2f8);
        uVar22 = local_2f8._0_8_;
        File::close((File *)local_418,(int)piVar21);
        pcVar28 = pcVar28 + uVar22;
        paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar31->_M_local_buf + 0x20);
        psVar20 = local_350;
      } while (paVar31 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pbVar3);
    }
    File::~File((File *)local_418);
    pMVar30 = local_420;
  }
  else {
    pcVar28 = (pointer)0x0;
  }
  mergePlayItems((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)local_2f8,
                 (vector<MPLSParser,_std::allocator<MPLSParser>_> *)(local_330 + 0x18));
  pAVar15 = createCodec(psVar20,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_388,codecStreamName_00,
                        (vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)local_2f8);
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector
            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)local_2f8);
  local_428 = pAVar15;
  (*(pAVar15->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[0xb])
            (pAVar15,(ulong)((int)((ulong)((long)(pMVar30->m_codecInfo).
                                                 super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pMVar30->m_codecInfo).
                                                super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                             -0xf0f0f0f + 1));
  (*(local_428->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[0xc])
            (local_428,(pMVar30->super_AbstractDemuxer).m_timeOffset);
  if ((pMVar30->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pMVar30->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_428->m_flags = local_428->m_flags | 1;
  }
  strToLowerCase((string *)local_418,
                 local_3b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  trimStr(&local_450,(string *)local_418);
  unquoteStr((string *)local_2f8,&local_450);
  std::__cxx11::string::operator=((string *)local_418,(string *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,(ulong)(local_450.field_2._M_allocated_capacity + 1))
    ;
  }
  local_2f8._0_8_ = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,".h264","");
  bVar33 = strEndWith((string *)local_418,(string *)local_2f8);
  bVar6 = true;
  if (!bVar33) {
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,".264","");
    bVar33 = strEndWith((string *)local_418,&local_450);
    bVar6 = true;
    if (!bVar33) {
      local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,".mvc","");
      bVar6 = strEndWith((string *)local_418,(string *)local_3d8);
      pMVar30 = local_420;
      if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
        pMVar30 = local_420;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,
                      (ulong)(local_450.field_2._M_allocated_capacity + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
  }
  p_Var32 = local_388;
  this_00 = &pMVar30->m_containerReader;
  local_3a0 = (BufferedReader *)this_00;
  if (bVar6 == false) {
    local_2f8._0_8_ = local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,".ts","");
    bVar33 = strEndWith((string *)local_418,(string *)local_2f8);
    bVar6 = true;
    if (!bVar33) {
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,".m2ts","");
      bVar33 = strEndWith((string *)local_418,&local_450);
      bVar6 = true;
      if (!bVar33) {
        local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,".mts","");
        bVar33 = strEndWith((string *)local_418,(string *)local_3d8);
        bVar6 = true;
        if (!bVar33) {
          local_370._0_8_ = (pointer)(local_370 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_370,".ssif","");
          bVar6 = strEndWith((string *)local_418,(string *)local_370);
          p_Var32 = local_388;
          if ((pointer)local_370._0_8_ != (pointer)(local_370 + 0x10)) {
            operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
            p_Var32 = local_388;
          }
        }
        pMVar30 = local_420;
        if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
          pMVar30 = local_420;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        (ulong)(local_450.field_2._M_allocated_capacity + 1));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != local_2e8) {
      operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
    }
    if (bVar6 == false) {
      local_2f8._0_8_ = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,".vob","");
      bVar33 = strEndWith((string *)local_418,(string *)local_2f8);
      bVar6 = true;
      if (!bVar33) {
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,".evo","");
        bVar33 = strEndWith((string *)local_418,&local_450);
        bVar6 = true;
        if (!bVar33) {
          local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,".mpg","");
          bVar6 = strEndWith((string *)local_418,(string *)local_3d8);
          pMVar30 = local_420;
          if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
            operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
            pMVar30 = local_420;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,
                          (ulong)(local_450.field_2._M_allocated_capacity + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
      }
      if (bVar6 == false) {
        local_2f8._0_8_ = local_2e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,".mkv","");
        bVar33 = strEndWith((string *)local_418,(string *)local_2f8);
        bVar6 = true;
        if (!bVar33) {
          local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,".mka","");
          bVar33 = strEndWith((string *)local_418,&local_450);
          bVar6 = true;
          if (!bVar33) {
            local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,".mks","");
            bVar6 = strEndWith((string *)local_418,(string *)local_3d8);
            pMVar30 = local_420;
            if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
              operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
              pMVar30 = local_420;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_dataplus._M_p != &local_450.field_2) {
            operator_delete(local_450._M_dataplus._M_p,
                            (ulong)(local_450.field_2._M_allocated_capacity + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._0_8_ != local_2e8) {
          operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
        }
        if (bVar6 == false) {
          local_2f8._0_8_ = local_2e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,".mov","");
          bVar33 = strEndWith((string *)local_418,(string *)local_2f8);
          bVar6 = true;
          if (!bVar33) {
            local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,".mp4","");
            bVar33 = strEndWith((string *)local_418,&local_450);
            bVar6 = true;
            if (!bVar33) {
              local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,".m4v","");
              bVar33 = strEndWith((string *)local_418,(string *)local_3d8);
              bVar6 = true;
              if (!bVar33) {
                local_370._0_8_ = (pointer)(local_370 + 0x10);
                std::__cxx11::string::_M_construct<char_const*>((string *)local_370,".m4a","");
                bVar6 = strEndWith((string *)local_418,(string *)local_370);
                p_Var32 = local_388;
                if ((pointer)local_370._0_8_ != (pointer)(local_370 + 0x10)) {
                  operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
                  p_Var32 = local_388;
                }
              }
              pMVar30 = local_420;
              if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
                operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
                pMVar30 = local_420;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450._M_dataplus._M_p != &local_450.field_2) {
              operator_delete(local_450._M_dataplus._M_p,
                              (ulong)(local_450.field_2._M_allocated_capacity + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._0_8_ != local_2e8) {
            operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
          }
          if (bVar6 == false) {
            local_3a0 = (BufferedReader *)
                        BufferedReaderManager::getReader
                                  (pMVar30->m_readManager,
                                   *(char **)local_3b8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
          }
          else {
            if (local_430 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,
                         "For streams inside MOV/MP4 container need track parameter.",0x3a);
              puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar18 = 0x1f6;
              *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
              if (local_158 == &local_148) {
                puVar18[6] = local_148;
                puVar18[7] = uStack_144;
                puVar18[8] = uStack_140;
                puVar18[9] = uStack_13c;
              }
              else {
                *(uint **)(puVar18 + 2) = local_158;
                *(ulong *)(puVar18 + 6) = CONCAT44(uStack_144,local_148);
              }
              *(undefined8 *)(puVar18 + 4) = local_150;
              local_150 = 0;
              local_148 = local_148 & 0xffffff00;
              local_158 = &local_148;
              __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            if (local_340 != (FileListIterator *)0x0) {
              pCVar25 = (ContainerToReaderWrapper *)0x0;
              if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
                  (_func_int **)&PTR__ContainerToReaderWrapper_0023e278) {
                pCVar25 = this_00;
              }
              ContainerToReaderWrapper::setFileIterator
                        (pCVar25,*(char **)local_3b8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                         &local_340->super_FileNameIterator);
            }
            local_428->m_containerType = ctMOV;
          }
        }
        else {
          if (local_430 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f8,"For streams inside MKV container need track parameter."
                       ,0x36);
            puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar18 = 0x1f6;
            *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
            if (local_138 == &local_128) {
              puVar18[6] = local_128;
              puVar18[7] = uStack_124;
              puVar18[8] = uStack_120;
              puVar18[9] = uStack_11c;
            }
            else {
              *(uint **)(puVar18 + 2) = local_138;
              *(ulong *)(puVar18 + 6) = CONCAT44(uStack_124,local_128);
            }
            *(undefined8 *)(puVar18 + 4) = local_130;
            local_130 = 0;
            local_128 = local_128 & 0xffffff00;
            local_138 = &local_128;
            __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if (local_340 != (FileListIterator *)0x0) {
            pCVar25 = (ContainerToReaderWrapper *)0x0;
            if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
                (_func_int **)&PTR__ContainerToReaderWrapper_0023e278) {
              pCVar25 = this_00;
            }
            ContainerToReaderWrapper::setFileIterator
                      (pCVar25,*(char **)local_3b8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                       &local_340->super_FileNameIterator);
          }
          local_428->m_containerType = ctMKV;
        }
      }
      else {
        if (local_430 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2f8,
                     "For streams inside MPG/VOB/EVO container need track parameter.",0x3e);
          puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar18 = 0x1f6;
          *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
          if (local_118 == &local_108) {
            puVar18[6] = local_108;
            puVar18[7] = uStack_104;
            puVar18[8] = uStack_100;
            puVar18[9] = uStack_fc;
          }
          else {
            *(uint **)(puVar18 + 2) = local_118;
            *(ulong *)(puVar18 + 6) = CONCAT44(uStack_104,local_108);
          }
          *(undefined8 *)(puVar18 + 4) = local_110;
          local_110 = 0;
          local_108 = local_108 & 0xffffff00;
          local_118 = &local_108;
          __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        if (local_340 != (FileListIterator *)0x0) {
          pCVar25 = (ContainerToReaderWrapper *)0x0;
          if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
              (_func_int **)&PTR__ContainerToReaderWrapper_0023e278) {
            pCVar25 = this_00;
          }
          ContainerToReaderWrapper::setFileIterator
                    (pCVar25,*(char **)local_3b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                     &local_340->super_FileNameIterator);
        }
        local_2f8._0_8_ = local_2e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,".evo","");
        bVar33 = strEndWith((string *)local_418,(string *)local_2f8);
        bVar6 = true;
        if (!bVar33) {
          local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,".evo\"","");
          bVar6 = strEndWith((string *)local_418,&local_450);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_dataplus._M_p != &local_450.field_2) {
            operator_delete(local_450._M_dataplus._M_p,
                            (ulong)(local_450.field_2._M_allocated_capacity + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._0_8_ != local_2e8) {
          operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
        }
        pMVar30 = local_420;
        if (bVar6 == false) {
          local_428->m_containerType = ctVOB;
        }
        else {
          local_428->m_containerType = ctEVOB;
        }
      }
    }
    else {
      if (local_430 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2f8,"For streams inside TS/M2TS container need track parameter."
                   ,0x3a);
        puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar18 = 0x1f6;
        *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
        if (local_f8 == &local_e8) {
          puVar18[6] = local_e8;
          puVar18[7] = uStack_e4;
          puVar18[8] = uStack_e0;
          puVar18[9] = uStack_dc;
        }
        else {
          *(uint **)(puVar18 + 2) = local_f8;
          *(ulong *)(puVar18 + 6) = CONCAT44(uStack_e4,local_e8);
        }
        *(undefined8 *)(puVar18 + 4) = local_f0;
        local_f0 = 0;
        local_e8 = local_e8 & 0xffffff00;
        local_f8 = &local_e8;
        __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      if (local_340 != (FileListIterator *)0x0) {
        pCVar25 = (ContainerToReaderWrapper *)0x0;
        if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
            (_func_int **)&PTR__ContainerToReaderWrapper_0023e278) {
          pCVar25 = this_00;
        }
        ContainerToReaderWrapper::setFileIterator
                  (pCVar25,*(char **)local_3b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                   &local_340->super_FileNameIterator);
      }
      local_2f8._0_8_ = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,".ts","");
      bVar33 = strEndWith((string *)local_418,(string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
      }
      pMVar30 = local_420;
      if (bVar33) {
        local_428->m_containerType = ctTS;
      }
      else {
        local_428->m_containerType = ctM2TS;
      }
    }
  }
  else if (local_430 == 0) {
    local_3a0 = (BufferedReader *)
                BufferedReaderManager::getReader
                          (pMVar30->m_readManager,
                           *(char **)local_3b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_428->m_containerType = ctMultiH264;
    if (local_340 != (FileListIterator *)0x0) {
      ContainerToReaderWrapper::setFileIterator
                (this_00,*(char **)local_3b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                 &local_340->super_FileNameIterator);
    }
  }
  if (local_3a0 == (BufferedReader *)0x0) {
    if (local_428 != (AbstractStreamReader *)0x0) {
      (*(local_428->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[1])();
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2f8,
               "This version do not support multicast or other network steams for muxing",0x48);
    puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar18 = 0x1f6;
    *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
    if (local_178 == &local_168) {
      puVar18[6] = local_168;
      puVar18[7] = uStack_164;
      puVar18[8] = uStack_160;
      puVar18[9] = uStack_15c;
    }
    else {
      *(uint **)(puVar18 + 2) = local_178;
      *(ulong *)(puVar18 + 6) = CONCAT44(uStack_164,local_168);
    }
    *(undefined8 *)(puVar18 + 4) = local_170;
    local_170 = 0;
    local_168 = local_168 & 0xffffff00;
    local_178 = &local_168;
    __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  std::vector<StreamInfo,std::allocator<StreamInfo>>::
  emplace_back<AbstractReader*&,AbstractStreamReader*&,std::__cxx11::string&,std::__cxx11::string_const&,int&,bool&>
            ((vector<StreamInfo,std::allocator<StreamInfo>> *)&pMVar30->m_codecInfo,
             (AbstractReader **)&local_3a0,&local_428,
             local_3b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._16_8_,
             &local_430,&local_429);
  if (((local_340 != (FileListIterator *)0x0) && (local_3a0 != (BufferedReader *)0x0)) &&
     ((local_3a0->super_AbstractReader)._vptr_AbstractReader ==
      (_func_int **)&PTR__BufferedReader_0023cf80)) {
    BufferedReader::setFileIterator
              (local_3a0,&local_340->super_FileNameIterator,
               (pMVar30->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].m_readerID);
  }
  pSVar5 = (pMVar30->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)&pSVar5[-1].m_codec);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&pSVar5[-1].m_addParams._M_t,p_Var32);
  if ((local_428->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader ==
      (_func_int **)&PTR__PGSStreamReader_0023f208) {
    *(char *)&local_428[1].super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader =
         (char)local_380;
    local_428[1].m_containerType = local_394;
    *(int *)((long)&local_428[1].super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader + 4)
         = local_38c;
    local_428[1].m_flags = local_390;
  }
  iVar8 = local_428->m_streamIndex;
  local_2f8._0_8_ = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"timeshift","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(p_Var32,(key_type *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
  }
  if (cVar10._M_node != local_348) {
    local_2f8._0_8_ = local_2e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2f8,*(long *)(cVar10._M_node + 2),
               (long)&(cVar10._M_node[2]._M_parent)->_M_color + *(long *)(cVar10._M_node + 2));
    lVar16 = std::__cxx11::string::find(local_2f8,0x20d81d,0);
    if (lVar16 == -1) {
      lVar16 = std::__cxx11::string::find((char)local_2f8,0x73);
      if (lVar16 == -1) {
        lVar16 = std::__cxx11::string::find(local_2f8,0x20e009,0);
        if (lVar16 == -1) {
          iVar9 = strToInt32((char *)local_2f8._0_8_);
          goto LAB_001a4436;
        }
        std::__cxx11::string::substr((ulong)&local_450,(ulong)local_2f8);
        iVar9 = strToInt32(local_450._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,
                          (ulong)(local_450.field_2._M_allocated_capacity + 1));
        }
        lVar16 = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_450,(ulong)local_2f8);
        iVar9 = strToInt32(local_450._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,
                          (ulong)(local_450.field_2._M_allocated_capacity + 1));
        }
        lVar16 = 1000000000;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_450,(ulong)local_2f8);
      iVar9 = strToInt32(local_450._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        (ulong)(local_450.field_2._M_allocated_capacity + 1));
      }
LAB_001a4436:
      lVar16 = 1000000;
    }
    lVar17 = ((iVar9 * lVar16) / 1000) * 0x14ac;
    pSVar5[-1].m_timeShift = lVar17;
    if (999 < iVar9 * lVar16) {
      pSVar5[-1].m_lastDTS = lVar17;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != local_2e8) {
      operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
    }
  }
  local_2f8._0_8_ = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"lang","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(local_388,(key_type *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
  }
  if (cVar10._M_node != local_348) {
    std::__cxx11::string::_M_assign((string *)&pSVar5[-1].m_lang);
  }
  local_420->m_totalSize = (int64_t)(pcVar28 + local_420->m_totalSize);
  if ((pointer)local_418._0_8_ != (pointer)local_408) {
    operator_delete((void *)local_418._0_8_,(ulong)(local_408._0_8_ + 1));
  }
LAB_001a45fd:
  std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector
            ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)(local_330 + 0x18));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b8);
  return iVar8;
}

Assistant:

int METADemuxer::addStream(const string& codec, const string& codecStreamName, const map<string, string>& addParams)
{
    int32_t pid = 0;
    auto tmpitr = addParams.find("track");
    if (tmpitr != addParams.end())
        pid = strToInt32(tmpitr->second.c_str());

    tmpitr = addParams.find("subTrack");
    if (tmpitr != addParams.end())
        pid = SubTrackFilter::pidToSubPid(pid, strToInt32(tmpitr->second));

    vector<string> fileList;
    string unquotedStreamName = unquoteStr(codecStreamName);
    string fileExt = strToLowerCase(extractFileExt(codecStreamName));
    std::vector<MPLSParser> mplsInfoList;

    // filds for SS PG
    int leftEyeSubStreamIdx = -1;
    int rightEyeSubStreamIdx = -1;
    bool isSSPG = false;
    int ssPGOffset = 0xff;
    ////

    bool isSubStream = (codec == h264DepCodecInfo.programName) || addParams.find("subClip") != addParams.end();
    if (fileExt == "mpls" || fileExt == "mpl")
    {
        mplsInfoList = getMplsInfo(codecStreamName);
        vector<string> mplsNames = splitQuotedStr(codecStreamName.c_str(), '+');
        for (size_t k = 0; k < mplsInfoList.size(); ++k)
        {
            MPLSParser& mplsInfo = mplsInfoList[k];
            unquotedStreamName = unquoteStr(mplsNames[k]);
            for (size_t i = 0; i < mplsInfo.m_playItems.size(); ++i)
            {
                string playItemName;
                if (isSubStream)
                {
                    if (mplsInfo.m_mvcFiles.empty())
                    {
                        THROW(ERR_INVALID_CODEC_FORMAT,
                              "Current playlist file doesn't has MVC track info. Please, remove MVC track from the "
                              "track list")
                    }
                    if (mplsInfo.m_mvcFiles.size() <= i)
                        THROW(ERR_INVALID_CODEC_FORMAT,
                              "Bad playlist file: number of CLPI files for AVC and VMC parts do not match")
                    playItemName = mplsInfo.m_mvcFiles[i];
                }
                else
                {
                    playItemName = mplsInfo.m_playItems[i].fileName;
                }
                string fileName = mplsTrackToFullName(unquotedStreamName, playItemName);
                if (mplsInfo.isDependStreamExist && !fileExists(fileName))
                    fileName = mplsTrackToSSIFName(unquotedStreamName, mplsInfo.m_playItems[i].fileName);
                fileList.push_back(fileName);
            }

            MPLSStreamInfo streamInfo = mplsInfo.getStreamByPID(pid);
            if (streamInfo.stream_coding_type == StreamType::SUB_PGS && streamInfo.isSSPG)
            {
                // add refs to addition tracks for stereo subtitles
                leftEyeSubStreamIdx = addPGSubStream(codec, unquotedStreamName, addParams, streamInfo.leftEye);
                rightEyeSubStreamIdx = addPGSubStream(codec, unquotedStreamName, addParams, streamInfo.rightEye);

                isSSPG = streamInfo.isSSPG;
                ssPGOffset = streamInfo.SS_PG_offset_sequence_id;
            }
        }
    }
    else
    {
        fileList = extractFileList(codecStreamName);
    }

    for (int i = static_cast<int>(fileList.size()) - 1; i >= 0; --i)
    {
        string trackKey = fileList[i] + string("_#") + int32ToStr(i) + string("_");
        if (addParams.find("subClip") == addParams.end())
            trackKey += string("_track_");
        else
            trackKey += string("_subtrack_");
        trackKey += int32ToStr(pid);
        if (m_processedTracks.find(trackKey) != m_processedTracks.end())
            fileList.erase(fileList.begin() + i);
        else
            m_processedTracks.insert(trackKey);
    }
    if (fileList.empty())
        return -1;

    FileListIterator* listIterator = nullptr;
    if (fileList.size() > 1)
    {
        listIterator = new FileListIterator();
        m_iterators.push_back(listIterator);
        for (const string& fileName : fileList) listIterator->addFile(fileName);
    }

    int64_t fileSize = 0;

    if (m_containerReader.m_demuxers.find(fileList[0]) == m_containerReader.m_demuxers.end())
    {
        File tmpFile;
        for (const string& fileName : fileList)
        {
            if (!tmpFile.open(fileName.c_str(), File::ofRead))
                THROW(ERR_INVALID_CODEC_FORMAT, "Can't open file: " << fileName.c_str())
            int64_t tmpSize = 0;
            tmpFile.size(&tmpSize);
            fileSize += tmpSize;
            tmpFile.close();
        }
    }

    AbstractStreamReader* codecReader = createCodec(codec, addParams, fileList[0], mergePlayItems(mplsInfoList));
    codecReader->setStreamIndex(static_cast<int>(m_codecInfo.size() + 1));
    codecReader->setTimeOffset(m_timeOffset);

    if (m_codecInfo.empty())
        codecReader->m_flags |= AVPacket::PCR_STREAM;

    AbstractReader* dataReader;
    string tmpname = strToLowerCase(fileList[0]);
    tmpname = unquoteStr(trimStr(tmpname));

    if (strEndWith(tmpname, ".h264") || strEndWith(tmpname, ".264") || strEndWith(tmpname, ".mvc"))
    {
        if (pid)
        {
            dataReader = &m_containerReader;
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMultiH264);
            if (listIterator)
                dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        }
        else
        {
            dataReader = m_readManager.getReader(fileList[0].c_str());
        }
    }
    else if (strEndWith(tmpname, ".ts") || strEndWith(tmpname, ".m2ts") || strEndWith(tmpname, ".mts") ||
             strEndWith(tmpname, ".ssif"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside TS/M2TS container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        if (strEndWith(tmpname, ".ts"))
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctTS);
        else
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctM2TS);
    }
    else if (strEndWith(tmpname, ".vob") || strEndWith(tmpname, ".evo") || strEndWith(tmpname, ".mpg"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MPG/VOB/EVO container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        if (strEndWith(tmpname, ".evo") || strEndWith(tmpname, ".evo\""))
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctEVOB);
        else
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctVOB);
    }
    else if (strEndWith(tmpname, ".mkv") || strEndWith(tmpname, ".mka") || strEndWith(tmpname, ".mks"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MKV container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMKV);
    }
    else if (strEndWith(tmpname, ".mov") || strEndWith(tmpname, ".mp4") || strEndWith(tmpname, ".m4v") ||
             strEndWith(tmpname, ".m4a"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MOV/MP4 container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMOV);
    }
    else
    {
        dataReader = m_readManager.getReader(fileList[0].c_str());
    }
    if (dataReader == nullptr)
    {
        delete codecReader;
        THROW(ERR_INVALID_CODEC_FORMAT, "This version do not support multicast or other network steams for muxing")
    }

    m_codecInfo.emplace_back(dataReader, codecReader, fileList[0], codecStreamName, pid, isSubStream);
    if (listIterator)
    {
        auto fileReader = dynamic_cast<BufferedFileReader*>(dataReader);
        if (fileReader)
            fileReader->setFileIterator(listIterator, m_codecInfo.rbegin()->m_readerID);
    }

    StreamInfo& streamInfo = *m_codecInfo.rbegin();
    streamInfo.m_codec = codec;
    streamInfo.m_addParams = addParams;
    int streamIndex = codecReader->getStreamIndex();

    // fields for SS PG stream
    auto pgStream = dynamic_cast<PGSStreamReader*>(codecReader);
    if (pgStream)
    {
        pgStream->isSSPG = isSSPG;
        pgStream->ssPGOffset = ssPGOffset;
        pgStream->leftEyeSubStreamIdx = leftEyeSubStreamIdx;
        pgStream->rightEyeSubStreamIdx = rightEyeSubStreamIdx;
    }
    //

    auto itr = addParams.find("timeshift");
    if (itr != addParams.end())
    {
        string timeShift = itr->second;
        size_t pos = 0;
        int64_t coeff = 1;
        int64_t value = 0;
        if ((pos = timeShift.find("ms")) != std::string::npos)
        {
            coeff = 1000000;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else if ((pos = timeShift.find('s')) != std::string::npos)
        {
            coeff = 1000000000;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else if ((pos = timeShift.find("ns")) != std::string::npos)
        {
            coeff = 1;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else
        {
            coeff = 1000000;
            value = strToInt32(timeShift.c_str());
        }
        value = value * coeff / 1000 * INTERNAL_PTS_FREQ / 1000000;
        streamInfo.m_timeShift = value;
        if (value > 0)
            streamInfo.m_lastDTS = value;
    }

    itr = addParams.find("lang");
    if (itr != addParams.end())
        streamInfo.m_lang = itr->second;
    m_totalSize += fileSize;

    return streamIndex;
}